

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

matches * atomreg(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  line *plVar2;
  int iVar3;
  matches *__ptr;
  match *res;
  expr *peVar4;
  expr **ppeVar5;
  
  if (ctx->reverse == 0) {
    peVar4 = printreg(ctx,a,m,(reg *)v);
    if (peVar4 == (expr *)0x0) {
      peVar4 = (expr *)calloc(0x48,1);
    }
    iVar3 = ctx->atomsnum;
    iVar1 = ctx->atomsmax;
    if (iVar3 < iVar1) {
      ppeVar5 = ctx->atoms;
    }
    else {
      iVar3 = 0x10;
      if (iVar1 != 0) {
        iVar3 = iVar1 * 2;
      }
      ctx->atomsmax = iVar3;
      ppeVar5 = (expr **)realloc(ctx->atoms,(long)iVar3 << 3);
      ctx->atoms = ppeVar5;
      iVar3 = ctx->atomsnum;
    }
    ctx->atomsnum = iVar3 + 1;
    ppeVar5[iVar3] = peVar4;
  }
  else {
    plVar2 = ctx->line;
    if (plVar2->atomsnum != spos) {
      __ptr = (matches *)calloc(0x10,1);
      __ptr->mmax = 0x10;
      res = (match *)malloc(0xb80);
      __ptr->m = res;
      __ptr->mnum = 1;
      *(undefined8 *)res = 0;
      res->a[0] = 0;
      res->a[1] = 0;
      res->m[0] = 0;
      res->m[1] = 0;
      res->lpos = spos + 1;
      memset(&res->field_0x2c,0,0x8c);
      iVar3 = matchreg(res,(reg *)v,plVar2->atoms[spos],ctx);
      if (iVar3 != 0) {
        return __ptr;
      }
      free(res);
      free(__ptr);
    }
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomreg APROTO {
	const struct reg *reg = v;
	if (ctx->reverse) {
		if (spos == ctx->line->atomsnum)
			return 0;
		struct matches *res = alwaysmatches(spos+1);
		if (matchreg(res->m, reg, ctx->line->atoms[spos], ctx))
			return res;
		else {
			free(res->m);
			free(res);
			return 0;
		}
	}
	struct expr *expr = printreg(ctx, a, m, reg);
	if (!expr) expr = makeex(EXPR_NUM);
	ADDARRAY(ctx->atoms, expr);
	return NULL;
}